

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

iterator __thiscall
pybind11::detail::
make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>
          (detail *this,
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
          first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
                last)

{
  type_info *ptVar1;
  class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
  *this_00;
  object extraout_RDX;
  iterator iVar2;
  handle local_78;
  iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>
  local_70;
  object local_58;
  return_value_policy local_4e;
  type local_4d [19];
  type local_3a;
  module_local local_39;
  handle local_38;
  class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>_>
  local_30;
  type_index local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
  last_local;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
  first_local;
  
  local_20 = last._M_node;
  last_local = first;
  std::type_index::type_index
            (&local_28,
             (type_info *)
             &iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>
              ::typeinfo);
  ptVar1 = get_type_info(&local_28,false);
  if (ptVar1 == (type_info *)0x0) {
    local_38.m_ptr = (PyObject *)0x0;
    pybind11::handle::handle(&local_38);
    module_local::module_local(&local_39,true);
    class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>_>
    ::class_<pybind11::module_local>(&local_30,local_38,"iterator",&local_39);
    this_00 = (class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
               *)class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
                 ::
                 def<pybind11::detail::make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>(std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>)::_lambda(pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>&)_1_>
                           ((class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
                             *)&local_30,"__iter__",&local_3a);
    local_4e = reference_internal;
    class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
    ::
    def<pybind11::detail::make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>(std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>)::_lambda(pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>&)_2_,pybind11::return_value_policy>
              (this_00,"__next__",local_4d,&local_4e);
    class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>_>
    ::~class_(&local_30);
  }
  local_70.it._M_node = last_local._M_node;
  local_70.end._M_node = local_20;
  local_70.first_or_done = true;
  local_78.m_ptr = (PyObject *)0x0;
  pybind11::handle::handle(&local_78);
  cast<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_0>
            ((pybind11 *)&local_58,&local_70,automatic_reference,local_78);
  iterator::iterator((iterator *)this,&local_58);
  object::~object(&local_58);
  iVar2.value.super_handle.m_ptr = extraout_RDX.super_handle.m_ptr;
  iVar2.super_object.super_handle.m_ptr = (handle)(handle)this;
  return iVar2;
}

Assistant:

iterator make_iterator_impl(Iterator first, Sentinel last, Extra &&... extra) {
    using state = detail::iterator_state<Access, Policy, Iterator, Sentinel, ValueType, Extra...>;
    // TODO: state captures only the types of Extra, not the values

    if (!detail::get_type_info(typeid(state), false)) {
        class_<state>(handle(), "iterator", pybind11::module_local())
            .def("__iter__", [](state &s) -> state& { return s; })
            .def("__next__", [](state &s) -> ValueType {
                if (!s.first_or_done)
                    ++s.it;
                else
                    s.first_or_done = false;
                if (s.it == s.end) {
                    s.first_or_done = true;
                    throw stop_iteration();
                }
                return Access()(s.it);
            // NOLINTNEXTLINE(readability-const-return-type) // PR #3263
            }, std::forward<Extra>(extra)..., Policy);
    }

    return cast(state{first, last, true});
}